

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shared.h
# Opt level: O1

SmartObject * __thiscall asl::SmartObject::operator=(SmartObject *this,SmartObject *n)

{
  AtomicCount *pAVar1;
  SmartObject_ *pSVar2;
  
  if (this->_p != (SmartObject_ *)0x0) {
    LOCK();
    pAVar1 = &this->_p->rc;
    pAVar1->n = pAVar1->n + -1;
    UNLOCK();
    if ((pAVar1->n == 0) && (this->_p != (SmartObject_ *)0x0)) {
      (*this->_p->_vptr_SmartObject_[1])();
    }
  }
  pSVar2 = n->_p;
  this->_p = pSVar2;
  if (pSVar2 != (SmartObject_ *)0x0) {
    LOCK();
    (pSVar2->rc).n = (pSVar2->rc).n + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

SmartObject& operator=(const SmartObject& n)
	{
		unref();
		_p = n._p;
		if (_p)
			++_p->rc;
		return *this;
	}